

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall kj::MainBuilder::MainImpl::printHelp(MainImpl *this,StringPtr programName)

{
  Impl *pIVar1;
  Arg *pAVar2;
  long *plVar3;
  undefined8 uVar4;
  size_t sVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  StringPtr *pSVar10;
  Arg *arg;
  Arg *this_00;
  MainImpl *pMVar11;
  char *pcVar12;
  undefined1 *puVar13;
  Vector<char> *pVVar14;
  char **in_R8;
  char (*params_2) [62];
  _Rb_tree_header *p_Var15;
  undefined1 *puVar16;
  long lVar17;
  StringPtr indent;
  StringPtr indent_00;
  StringPtr indent_01;
  Array<char> local_e0;
  MainImpl *local_c8;
  Vector<char> text;
  undefined1 local_a0 [16];
  size_t sStack_90;
  ArrayDisposer *local_88;
  _Rb_tree_node_base *local_78;
  StringPtr programName_local;
  set<const_kj::MainBuilder::Impl::Option_*,_kj::MainBuilder::Impl::OptionDisplayOrder,_std::allocator<const_kj::MainBuilder::Impl::Option_*>_>
  sortedOptions;
  
  programName_local.content.size_ = programName.content.size_;
  programName_local.content.ptr = programName.content.ptr;
  text.builder.ptr = _::HeapArrayDisposer::allocateUninitialized<char>(0x400);
  text.builder.endPtr = text.builder.ptr + 0x400;
  text.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header;
  sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar1 = (this->impl).ptr;
  text.builder.pos = text.builder.ptr;
  sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var7 = (pIVar1->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(pIVar1->shortOptions)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::
    _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
    ::_M_insert_unique<kj::MainBuilder::Impl::Option_const*const&>
              ((_Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
                *)&sortedOptions,(Option **)&p_Var7[1]._M_parent);
  }
  pIVar1 = (this->impl).ptr;
  for (p_Var7 = (pIVar1->longOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(pIVar1->longOptions)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::
    _Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
    ::_M_insert_unique<kj::MainBuilder::Impl::Option_const*const&>
              ((_Rb_tree<kj::MainBuilder::Impl::Option_const*,kj::MainBuilder::Impl::Option_const*,std::_Identity<kj::MainBuilder::Impl::Option_const*>,kj::MainBuilder::Impl::OptionDisplayOrder,std::allocator<kj::MainBuilder::Impl::Option_const*>>
                *)&sortedOptions,(Option **)&p_Var7[1]._M_left);
  }
  local_a0._0_8_ = " [<option>...]";
  if (sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_a0._0_8_ = "";
  }
  pSVar10 = (StringPtr *)local_a0;
  str<char_const(&)[8],kj::StringPtr&,char_const*>
            ((String *)&local_e0,(kj *)"Usage: ",(char (*) [8])&programName_local,pSVar10,in_R8);
  Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
  Array<char>::~Array(&local_e0);
  pIVar1 = (this->impl).ptr;
  local_c8 = this;
  if ((pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pAVar2 = (pIVar1->args).builder.pos;
    for (this_00 = (pIVar1->args).builder.ptr; this_00 != pAVar2; this_00 = this_00 + 1) {
      local_e0.ptr = (char *)CONCAT71(local_e0.ptr._1_7_,0x20);
      Vector<char>::add<char>(&text,(char *)&local_e0);
      if (this_00->minCount == 0) {
        local_a0._0_8_ = "]";
        if (1 < this_00->maxCount) {
          local_a0._0_8_ = "...]";
        }
        pSVar10 = (StringPtr *)local_a0;
        str<char_const(&)[2],kj::StringPtr&,char_const*>
                  ((String *)&local_e0,(kj *)"[",(char (*) [2])this_00,(StringPtr *)local_a0,in_R8);
        Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
      }
      else {
        local_a0._0_8_ = "";
        if (1 < this_00->maxCount) {
          local_a0._0_8_ = "...";
        }
        str<kj::StringPtr&,char_const*>
                  ((String *)&local_e0,(kj *)this_00,(StringPtr *)local_a0,(char **)pSVar10);
        Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
      }
      Array<char>::~Array(&local_e0);
    }
  }
  else {
    local_e0.ptr = " <command> [<arg>...]";
    local_e0.size_ = 0x16;
    Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
  }
  local_e0.ptr = "\n\n";
  local_e0.size_ = 3;
  pVVar14 = &text;
  Vector<char>::addAll<kj::StringPtr>(pVVar14,(StringPtr *)&local_e0);
  pMVar11 = local_c8;
  pSVar10 = &((local_c8->impl).ptr)->briefDescription;
  params_2 = (char (*) [62])(pSVar10->content).ptr;
  indent.content.size_ = 1;
  indent.content.ptr = "";
  wrapText((MainImpl *)pVVar14,&text,indent,(StringPtr)pSVar10->content);
  if ((((pMVar11->impl).ptr)->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  goto LAB_00306bf7;
  do {
    if (sortedOptions._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_e0.ptr = "\nOptions:\n";
      local_e0.size_ = 0xb;
      Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
      p_Var7 = sortedOptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_c8 = pMVar11;
      while ((_Rb_tree_header *)p_Var7 != &sortedOptions._M_t._M_impl.super__Rb_tree_header) {
        plVar3 = *(long **)(p_Var7 + 1);
        local_e0.ptr = "    ";
        local_e0.size_ = 5;
        local_78 = p_Var7;
        Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
        pcVar12 = (char *)(*plVar3 + 8);
        bVar6 = true;
        for (lVar17 = plVar3[1] << 4; lVar17 != 0; lVar17 = lVar17 + -0x10) {
          if (!bVar6) {
            local_e0.ptr = ", ";
            local_e0.size_ = 3;
            Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
          }
          if (pcVar12[-8] == '\x01') {
            str<char_const(&)[3],char_const*const&>
                      ((String *)&local_e0,(kj *)"--",(char (*) [3])pcVar12,(char **)p_Var7);
            Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
            Array<char>::~Array(&local_e0);
            if ((char)plVar3[2] == '\x01') {
              str<char_const(&)[2],kj::StringPtr_const&>
                        ((String *)&local_e0,(kj *)0x339742,(char (*) [2])(plVar3 + 4),
                         (StringPtr *)p_Var7);
              Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
              Array<char>::~Array(&local_e0);
            }
          }
          else {
            str<char_const(&)[2],char_const&>
                      ((String *)&local_e0,(kj *)0x37dc05,(char (*) [2])pcVar12,(char *)p_Var7);
            Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
            Array<char>::~Array(&local_e0);
            if ((char)plVar3[2] == '\x01') {
              Vector<char>::addAll<kj::StringPtr_const&>(&text,(StringPtr *)(plVar3 + 4));
            }
          }
          pcVar12 = pcVar12 + 0x10;
          bVar6 = false;
        }
        local_e0.ptr = (char *)CONCAT71(local_e0.ptr._1_7_,10);
        pVVar14 = &text;
        Vector<char>::add<char>(&text,(char *)&local_e0);
        params_2 = (char (*) [62])((ArrayPtr<const_char> *)(plVar3 + 6))->ptr;
        indent_00.content.size_ = 9;
        indent_00.content.ptr = "        ";
        wrapText((MainImpl *)pVVar14,&text,indent_00,
                 (StringPtr)*(ArrayPtr<const_char> *)(plVar3 + 6));
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_78);
      }
      local_e0.ptr = "    --help\n        Display this help text and exit.\n";
      local_e0.size_ = 0x35;
      Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
      pMVar11 = local_c8;
    }
    if ((((pMVar11->impl).ptr)->extendedDescription).content.size_ != 1) {
      local_e0.ptr = (char *)CONCAT71(local_e0.ptr._1_7_,10);
      pVVar14 = &text;
      Vector<char>::add<char>(pVVar14,(char *)&local_e0);
      pSVar10 = &((pMVar11->impl).ptr)->extendedDescription;
      params_2 = (char (*) [62])(pSVar10->content).ptr;
      indent_01.content.size_ = 1;
      indent_01.content.ptr = "";
      wrapText((MainImpl *)pVVar14,&text,indent_01,(StringPtr)pSVar10->content);
    }
    local_e0.ptr = (char *)((ulong)local_e0.ptr & 0xffffffffffffff00);
    Vector<char>::add<char>(&text,(char *)&local_e0);
    pMVar11 = (MainImpl *)((pMVar11->impl).ptr)->context;
    Vector<char>::releaseAsArray((Array<char> *)(local_a0 + 8),&text);
    sVar5 = sStack_90;
    uVar4 = local_a0._8_8_;
    local_e0.ptr = (char *)local_a0._8_8_;
    local_e0.size_ = sStack_90;
    local_e0.disposer = local_88;
    local_a0._8_8_ = (char *)0x0;
    sStack_90 = 0;
    pcVar12 = "";
    if (sVar5 != 0) {
      pcVar12 = (char *)uVar4;
    }
    (*(code *)(pMVar11->impl).disposer[5]._vptr_Disposer)(pMVar11,pcVar12,sVar5 + (sVar5 == 0));
LAB_00306bf7:
    local_e0.ptr = "\nCommands:\n";
    local_e0.size_ = 0xc;
    Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
    pIVar1 = (pMVar11->impl).ptr;
    p_Var15 = &(pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header;
    puVar16 = (undefined1 *)0x0;
    p_Var9 = (pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var8 = p_Var9; (_Rb_tree_header *)p_Var8 != p_Var15;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      puVar13 = (undefined1 *)((long)&p_Var8[1]._M_parent[-1]._M_right + 7);
      if (puVar16 <= puVar13) {
        puVar16 = puVar13;
      }
    }
    for (; (_Rb_tree_header *)p_Var9 != p_Var15;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      local_e0.ptr = "  ";
      local_e0.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
      Vector<char>::addAll<kj::StringPtr_const&>(&text,(StringPtr *)(p_Var9 + 1));
      for (puVar13 = (undefined1 *)((long)&p_Var9[1]._M_parent[-1]._M_right + 7); puVar13 < puVar16;
          puVar13 = puVar13 + 1) {
        local_e0.ptr = (char *)CONCAT71(local_e0.ptr._1_7_,0x20);
        Vector<char>::add<char>(&text,(char *)&local_e0);
      }
      local_e0.ptr = "  ";
      local_e0.size_ = 3;
      Vector<char>::addAll<kj::StringPtr>(&text,(StringPtr *)&local_e0);
      Vector<char>::addAll<kj::StringPtr&>(&text,(StringPtr *)(p_Var9 + 2));
      local_e0.ptr = (char *)CONCAT71(local_e0.ptr._1_7_,10);
      Vector<char>::add<char>(&text,(char *)&local_e0);
    }
    str<char_const(&)[7],kj::StringPtr&,char_const(&)[62]>
              ((String *)&local_e0,(kj *)"\nSee \'",(char (*) [7])&programName_local,
               (StringPtr *)" help <command>\' for more information on a specific command.\n",
               params_2);
    Vector<char>::addAll<kj::String>(&text,(String *)&local_e0);
    Array<char>::~Array(&local_e0);
    pMVar11 = local_c8;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::printHelp(StringPtr programName) {
  Vector<char> text(1024);

  std::set<const Impl::Option*, Impl::OptionDisplayOrder> sortedOptions;

  for (auto& entry: impl->shortOptions) {
    sortedOptions.insert(entry.second);
  }
  for (auto& entry: impl->longOptions) {
    sortedOptions.insert(entry.second);
  }

  text.addAll(str("Usage: ", programName, sortedOptions.empty() ? "" : " [<option>...]"));

  if (impl->subCommands.empty()) {
    for (auto& arg: impl->args) {
      text.add(' ');
      if (arg.minCount == 0) {
        text.addAll(str("[", arg.title, arg.maxCount > 1 ? "...]" : "]"));
      } else {
        text.addAll(str(arg.title, arg.maxCount > 1 ? "..." : ""));
      }
    }
  } else {
    text.addAll(StringPtr(" <command> [<arg>...]"));
  }
  text.addAll(StringPtr("\n\n"));

  wrapText(text, "", impl->briefDescription);

  if (!impl->subCommands.empty()) {
    text.addAll(StringPtr("\nCommands:\n"));
    size_t maxLen = 0;
    for (auto& command: impl->subCommands) {
      maxLen = kj::max(maxLen, command.first.size());
    }
    for (auto& command: impl->subCommands) {
      text.addAll(StringPtr("  "));
      text.addAll(command.first);
      for (size_t i = command.first.size(); i < maxLen; i++) {
        text.add(' ');
      }
      text.addAll(StringPtr("  "));
      text.addAll(command.second.helpText);
      text.add('\n');
    }
    text.addAll(str(
        "\nSee '", programName, " help <command>' for more information on a specific command.\n"));
  }

  if (!sortedOptions.empty()) {
    text.addAll(StringPtr("\nOptions:\n"));

    for (auto opt: sortedOptions) {
      text.addAll(StringPtr("    "));
      bool isFirst = true;
      for (auto& name: opt->names) {
        if (isFirst) {
          isFirst = false;
        } else {
          text.addAll(StringPtr(", "));
        }
        if (name.isLong) {
          text.addAll(str("--", name.longName));
          if (opt->hasArg) {
            text.addAll(str("=", opt->argTitle));
          }
        } else {
          text.addAll(str("-", name.shortName));
          if (opt->hasArg) {
            text.addAll(opt->argTitle);
          }
        }
      }
      text.add('\n');
      wrapText(text, "        ", opt->helpText);
    }

    text.addAll(StringPtr("    --help\n        Display this help text and exit.\n"));
  }

  if (impl->extendedDescription.size() > 0) {
    text.add('\n');
    wrapText(text, "", impl->extendedDescription);
  }

  text.add('\0');
  impl->context.exitInfo(String(text.releaseAsArray()));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}